

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILPSolver.cpp
# Opt level: O1

int __thiscall
CILPSolver::Solve(CILPSolver *this,int iOption,double *pObjectValue,double *pVariableValue)

{
  int iVar1;
  uint uVar2;
  char *__s;
  long lVar3;
  int j;
  bool bVar4;
  double dVar5;
  
  glp_lpx_set_obj_dir(this->m_pLPX,(((uint)iOption >> 0x18 & 1) != 0) + 0x78);
  glp_lpx_set_int_parm(this->m_pLPX,0x134,1);
  glp_lpx_set_int_parm(this->m_pLPX,300,1);
  glp_lpx_set_int_parm(this->m_pLPX,0x13a,1000);
  uVar2 = iOption & 0xfcff0000;
  if (uVar2 == 0x100000) {
    glp_lpx_set_class(this->m_pLPX,0x65);
    iVar1 = glp_lpx_get_num_cols(this->m_pLPX);
    if (0 < iVar1) {
      j = 1;
      do {
        glp_lpx_set_col_kind(this->m_pLPX,j,0xa1);
        bVar4 = j != iVar1;
        j = j + 1;
      } while (bVar4);
    }
    glp_lpx_set_int_parm(this->m_pLPX,0x149,0xff);
    glp_lpx_set_real_parm(this->m_pLPX,0x139,1800.0);
    glp_lpx_set_int_parm(this->m_pLPX,0x134,1);
    glp_lpx_set_int_parm(this->m_pLPX,300,1);
    glp_lpx_set_int_parm(this->m_pLPX,0x13a,1000);
    uVar2 = glp_lpx_intopt((LPX_conflict *)this->m_pLPX);
    if (uVar2 == 200) {
      if (pObjectValue != (double *)0x0) {
        dVar5 = glp_lpx_mip_obj_val(this->m_pLPX);
        *pObjectValue = dVar5;
      }
      if (pVariableValue != (double *)0x0) {
        iVar1 = glp_lpx_get_num_cols(this->m_pLPX);
        *pVariableValue = (double)iVar1;
        if (0 < iVar1) {
          lVar3 = 1;
          iVar1 = 2;
          do {
            dVar5 = glp_lpx_mip_col_val(this->m_pLPX,(int)lVar3);
            pVariableValue[lVar3] = dVar5;
            lVar3 = lVar3 + 1;
            dVar5 = (double)iVar1;
            iVar1 = iVar1 + 1;
          } while (dVar5 <= *pVariableValue);
        }
      }
    }
    else {
      printf("\n\tlpx_intopt..failed (%d)\n",(ulong)uVar2);
    }
  }
  else if (uVar2 == 0x20000) {
    uVar2 = glp_lpx_interior((LPX_conflict *)this->m_pLPX);
    if (uVar2 == 200) {
      if (pObjectValue != (double *)0x0) {
        dVar5 = glp_lpx_ipt_obj_val(this->m_pLPX);
        *pObjectValue = dVar5;
      }
      uVar2 = 200;
      if (pVariableValue != (double *)0x0) {
        iVar1 = glp_lpx_get_num_cols(this->m_pLPX);
        *pVariableValue = (double)iVar1;
        if (0 < iVar1) {
          lVar3 = 1;
          iVar1 = 2;
          do {
            dVar5 = glp_lpx_ipt_col_prim(this->m_pLPX,(int)lVar3);
            pVariableValue[lVar3] = dVar5;
            lVar3 = lVar3 + 1;
            dVar5 = (double)iVar1;
            iVar1 = iVar1 + 1;
          } while (dVar5 <= *pVariableValue);
        }
      }
    }
  }
  else {
    if (uVar2 != 0x10000) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/ILPSolver.cpp"
                    ,0x109,"int CILPSolver::Solve(int, double *, double *)");
    }
    glp_lpx_set_int_parm(this->m_pLPX,0x147,1);
    glp_lpx_adv_basis((LPX_conflict *)this->m_pLPX);
    uVar2 = glp_lpx_simplex((LPX_conflict *)this->m_pLPX);
    if (uVar2 == 200) {
      if (pObjectValue != (double *)0x0) {
        dVar5 = glp_lpx_get_obj_val(this->m_pLPX);
        *pObjectValue = dVar5;
      }
      uVar2 = 200;
      if (pVariableValue != (double *)0x0) {
        iVar1 = glp_lpx_get_num_cols(this->m_pLPX);
        *pVariableValue = (double)iVar1;
        if (0 < iVar1) {
          lVar3 = 1;
          iVar1 = 2;
          do {
            dVar5 = glp_lpx_get_col_prim(this->m_pLPX,(int)lVar3);
            pVariableValue[lVar3] = dVar5;
            lVar3 = lVar3 + 1;
            dVar5 = (double)iVar1;
            iVar1 = iVar1 + 1;
          } while (dVar5 <= *pVariableValue);
        }
      }
    }
  }
  switch(uVar2) {
  case 200:
    return 1;
  case 0xc9:
    __s = "ILP error: empty problem";
    break;
  case 0xca:
    __s = "ILP error: invalid initial basis";
    break;
  case 0xcb:
    __s = "ILP error: infeasible initial solution";
    break;
  case 0xcc:
    __s = "ILP error: unable to start the search";
    break;
  case 0xcd:
    __s = "ILP error: objective lower limit reached";
    break;
  case 0xce:
    __s = "ILP error: objective upper limit reached";
    break;
  case 0xcf:
    __s = "ILP error: iterations limit exhausted";
    break;
  case 0xd0:
    __s = "ILP error: time limit exhausted";
    break;
  case 0xd1:
    __s = "ILP error: no feasible solution";
    break;
  case 0xd2:
    __s = "ILP error: numerical instability";
    break;
  case 0xd3:
    __s = "ILP error: problems with basis matrix";
    break;
  case 0xd4:
    __s = "ILP error: no convergence (interior)";
    break;
  case 0xd5:
    __s = "ILP error: no primal feas. sol. (LP presolver)";
    break;
  case 0xd6:
    __s = "ILP error: no dual feas. sol. (LP presolver)";
    break;
  default:
    printf("ILP error: unknown error code (%d)\n",(ulong)uVar2);
    return 0;
  }
  puts(__s);
  return 0;
}

Assistant:

int CILPSolver::Solve(int iOption,double* pObjectValue,double* pVariableValue)
{
	lpx_set_obj_dir(m_pLPX, iOption&SOL_OPTION_MAX? LPX_MAX:LPX_MIN);

	iOption	&=	~SOL_OPTION_MAX;
	iOption	&=	~SOL_OPTION_MIN;
	
	int	iResult;

	lpx_set_int_parm(m_pLPX,LPX_K_ROUND,1);
	lpx_set_int_parm(m_pLPX,LPX_K_MSGLEV,1);
	lpx_set_int_parm(m_pLPX,LPX_K_OUTFRQ,1000);
	
	switch(iOption&0xFFFF0000) {
	case SOL_OPTION_SIMPLEX:
		lpx_set_int_parm(m_pLPX,LPX_K_PRESOL,1);
		lpx_adv_basis(m_pLPX);
		iResult	=	lpx_simplex(m_pLPX);
		if(iResult==LPX_E_OK)
		{
			if(pObjectValue)	*pObjectValue	=	lpx_get_obj_val(m_pLPX);
			if(pVariableValue)	
			{
				pVariableValue[0]	=	lpx_get_num_cols(m_pLPX);
				for(int i=1;i<=pVariableValue[0];++i)
				{
					pVariableValue[i]	=	lpx_get_col_prim(m_pLPX,i);
				}				
			}
		}
		break;
	case SOL_OPTION_IPT:
		iResult	=	lpx_interior(m_pLPX);
		if(iResult==LPX_E_OK)
		{
			if(pObjectValue)	*pObjectValue	=	lpx_ipt_obj_val(m_pLPX);
			if(pVariableValue)	
			{
				pVariableValue[0]	=	lpx_get_num_cols(m_pLPX);
				for(int i=1;i<=pVariableValue[0];++i)
				{
					pVariableValue[i]	=	lpx_ipt_col_prim(m_pLPX,i);
				}				
			}
		}
		break;
	case SOL_OPTION_MIP:
		{
			lpx_set_class(m_pLPX,LPX_MIP);

			int	iNumVariable	=	lpx_get_num_cols(m_pLPX);			
			for(int i=1;i<=iNumVariable;++i)	lpx_set_col_kind(m_pLPX,i,LPX_IV);

			lpx_set_int_parm(m_pLPX,LPX_K_USECUTS,LPX_C_ALL);
			lpx_set_real_parm(m_pLPX,LPX_K_TMLIM,1800);	
			lpx_set_int_parm(m_pLPX,LPX_K_ROUND,1);
			lpx_set_int_parm(m_pLPX,LPX_K_MSGLEV,1);
			lpx_set_int_parm(m_pLPX,LPX_K_OUTFRQ,1000);

			iResult	=	lpx_intopt(m_pLPX);
			if(iResult==LPX_E_OK)
			{
				if(pObjectValue)	*pObjectValue	=	lpx_mip_obj_val(m_pLPX);
				if(pVariableValue)	
				{
					pVariableValue[0]	=	lpx_get_num_cols(m_pLPX);	
					for(int i=1;i<=pVariableValue[0];++i)	pVariableValue[i]	=	lpx_mip_col_val(m_pLPX,i);
				}
			}	
			else
			{
				printf("\n\tlpx_intopt..failed (%d)\n",iResult);
			}
		}
		break;
	default:
		assert(false);
		break;
	}
	
	switch(iResult) {
	case LPX_E_OK     : 
		return	1;
		break;
	case LPX_E_EMPTY  : printf("ILP error: empty problem\n");break;
	case LPX_E_BADB   : printf("ILP error: invalid initial basis\n");break;
	case LPX_E_INFEAS : printf("ILP error: infeasible initial solution\n");break;
	case LPX_E_FAULT  : printf("ILP error: unable to start the search\n");break;
	case LPX_E_OBJLL  : printf("ILP error: objective lower limit reached\n");break;
	case LPX_E_OBJUL  : printf("ILP error: objective upper limit reached\n");break;
	case LPX_E_ITLIM  : printf("ILP error: iterations limit exhausted\n");break;
	case LPX_E_TMLIM  : printf("ILP error: time limit exhausted\n");break;
	case LPX_E_NOFEAS : printf("ILP error: no feasible solution\n");break;
	case LPX_E_INSTAB : printf("ILP error: numerical instability\n");break;
	case LPX_E_SING   : printf("ILP error: problems with basis matrix\n");break;
	case LPX_E_NOCONV : printf("ILP error: no convergence (interior)\n");break;
	case LPX_E_NOPFS  : printf("ILP error: no primal feas. sol. (LP presolver)\n");break;
	case LPX_E_NODFS  : printf("ILP error: no dual feas. sol. (LP presolver)\n");break;
	default:			printf("ILP error: unknown error code (%d)\n",iResult);break;
	}

	return	0;
}